

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueTemplate.h
# Opt level: O0

bool __thiscall
L15_2::
QueueTemplate<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
dequeue(QueueTemplate<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i)

{
  Node *pNVar1;
  Node *this_00;
  Node *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_local;
  QueueTemplate<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (this->_first == (Node *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->_size = this->_size + -1;
    pNVar1 = this->_first->next;
    this_00 = this->_first;
    if (this_00 != (Node *)0x0) {
      Node::~Node(this_00);
      operator_delete(this_00);
    }
    this->_first = pNVar1;
    if (this->_size == 0) {
      this->_last = (Node *)0x0;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool QueueTemplate<T>::dequeue(T &i) {  //  still quite confused why this "T & i" is needed...
        if (_first == nullptr) {
            return false;
        }
        _size--;
        Node * f = _first->next;
        delete _first;
        _first = f;
        if (_size == 0) {
            _last = nullptr;
        }
        return true;
    }